

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::SliceHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  anon_class_24_3_6139f5b6_for_newObjectCreationFunction_conflict newObjectCreationFunction;
  uint32 uVar2;
  byte bVar3;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  int iVar7;
  ThreadContext *pTVar8;
  Var pvVar9;
  undefined4 *puVar10;
  RecyclableObject *pRVar11;
  SparseArraySegmentBase *pSVar12;
  JavascriptNativeIntArray *dstArray;
  JavascriptNativeIntArray *srcArray;
  JavascriptNativeFloatArray *dstArray_00;
  JavascriptNativeFloatArray *srcArray_00;
  undefined4 extraout_var;
  JavascriptArray *pJVar13;
  TypedArrayBase *local_2a8;
  unsigned_long local_1a8;
  JavascriptArray *jsArr;
  uint32 i_2;
  Var element_2;
  TypedArrayBase *newTypedArray;
  BOOL gotItem_1;
  uint32 i_1;
  Var element_1;
  BOOL gotItem;
  uint32 i;
  Var element;
  uint32 local_100;
  uint32 local_fc;
  uint32 newLen;
  uint32 start;
  unsigned_long uStack_f0;
  bool local_e8;
  undefined7 uStack_e7;
  byte local_d9;
  RecyclableObject *pRStack_d8;
  bool isDefaultConstructor;
  RecyclableObject *constructor;
  JavascriptFunction *defaultConstructor;
  unsigned_long endT;
  unsigned_long newLenT;
  unsigned_long startT;
  bool isBuiltinArrayCtor;
  bool isTypedArrayEntryPoint;
  bool isFloatArray;
  JavascriptArray *pJStack_a8;
  bool isIntArray;
  RecyclableObject *newObj;
  JavascriptArray *newArr;
  undefined1 local_88 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  unsigned_long length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  TypeId local_24;
  TypeId typeId;
  
  jsReentLock._24_8_ = scriptContext;
  pTVar8 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_88,pTVar8);
  JsReentLock::setObjectForMutation((JsReentLock *)local_88,pArr);
  newObj = (RecyclableObject *)0x0;
  pJStack_a8 = (JavascriptArray *)0x0;
  startT._7_1_ = 0;
  startT._6_1_ = 0;
  startT._5_1_ = typedArrayBase != (TypedArrayBase *)0x0;
  startT._4_1_ = 1;
  newLenT = 0;
  defaultConstructor = (JavascriptFunction *)length;
  endT = length;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pArr);
  if ((SUB84(args->Info,0) & 0xffffff) != 1 && ((ulong)args->Info & 0xffffff) != 0) {
    JsReentLock::unlock((JsReentLock *)local_88);
    pvVar9 = Arguments::operator[](args,1);
    newLenT = GetFromIndex<unsigned_long>(pvVar9,length,(ScriptContext *)jsReentLock._24_8_,true);
    JsReentLock::MutateArrayObject((JsReentLock *)local_88);
    JsReentLock::relock((JsReentLock *)local_88);
    if (2 < (SUB84(args->Info,0) & 0xffffff)) {
      pvVar9 = Arguments::operator[](args,2);
      if (pvVar9 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      bVar4 = TaggedInt::Is(pvVar9);
      if (bVar4) {
        local_24 = TypeIds_FirstNumberType;
      }
      else {
        bVar4 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar9);
        if (bVar4) {
          local_24 = TypeIds_Number;
        }
        else {
          pRVar11 = UnsafeVarTo<Js::RecyclableObject>(pvVar9);
          if (pRVar11 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar4) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          local_24 = RecyclableObject::GetTypeId(pRVar11);
          if ((0x57 < (int)local_24) && (BVar5 = RecyclableObject::IsExternal(pRVar11), BVar5 == 0))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar4) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
        }
      }
      if (local_24 != TypeIds_Undefined) {
        JsReentLock::unlock((JsReentLock *)local_88);
        pvVar9 = Arguments::operator[](args,2);
        defaultConstructor =
             (JavascriptFunction *)
             GetFromIndex<unsigned_long>(pvVar9,length,(ScriptContext *)jsReentLock._24_8_,true);
        JsReentLock::MutateArrayObject((JsReentLock *)local_88);
        JsReentLock::relock((JsReentLock *)local_88);
      }
    }
    if (newLenT < defaultConstructor) {
      local_1a8 = (long)defaultConstructor - newLenT;
    }
    else {
      local_1a8 = 0;
    }
    endT = local_1a8;
  }
  typedArrayBase_local = (TypedArrayBase *)pArr;
  if ((pArr != (JavascriptArray *)0x0) && (bVar4 = IsNonES5Array(obj), !bVar4)) {
    bVar4 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x18f8,"(VarIs<ES5Array>(obj))",
                                  "The array should have been converted to an ES5Array");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    typedArrayBase_local = (TypedArrayBase *)0x0;
  }
  BVar5 = Js::TypedArrayBase::IsDetachedTypedArray(obj);
  if (BVar5 != 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ebe5,L"Array.prototype.slice");
  }
  obj_local = (RecyclableObject *)typedArrayBase;
  if ((((startT._5_1_ & 1) == 0) && (typedArrayBase_local == (TypedArrayBase *)0x0)) &&
     (bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj), bVar4)) {
    obj_local = (RecyclableObject *)UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
  }
  if ((startT._5_1_ & 1) == 0) {
    if (typedArrayBase_local == (TypedArrayBase *)0x0) {
      JsReentLock::unlock((JsReentLock *)local_88);
      pJStack_a8 = (JavascriptArray *)
                   ArraySpeciesCreate<unsigned_long>
                             (obj,endT,(ScriptContext *)jsReentLock._24_8_,(bool *)0x0,(bool *)0x0,
                              (bool *)((long)&startT + 4));
      JsReentLock::relock((JsReentLock *)local_88);
    }
    else {
      JsReentLock::unlock((JsReentLock *)local_88);
      pJStack_a8 = (JavascriptArray *)
                   ArraySpeciesCreate<unsigned_long>
                             (typedArrayBase_local,endT,(ScriptContext *)jsReentLock._24_8_,
                              (bool *)((long)&startT + 7),(bool *)((long)&startT + 6),
                              (bool *)((long)&startT + 4));
      JsReentLock::relock((JsReentLock *)local_88);
    }
  }
  else {
    pvVar9 = Arguments::operator[](args,0);
    constructor = (RecyclableObject *)
                  Js::TypedArrayBase::GetDefaultConstructor
                            (pvVar9,(ScriptContext *)jsReentLock._24_8_);
    JsReentLock::unlock((JsReentLock *)local_88);
    pRStack_d8 = Js::JavascriptOperators::SpeciesConstructor
                           (obj_local,(JavascriptFunction *)constructor,
                            (ScriptContext *)jsReentLock._24_8_);
    JsReentLock::MutateArrayObject((JsReentLock *)local_88);
    JsReentLock::relock((JsReentLock *)local_88);
    startT._4_1_ = 0;
    if (typedArrayBase_local != (TypedArrayBase *)0x0) {
      if (typedArrayBase_local != (TypedArrayBase *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1910,"(pArr == nullptr)","pArr == nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar4 = Js::JavascriptOperators::IsConstructor(pRStack_d8);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1911,"(JavascriptOperators::IsConstructor(constructor))",
                                  "JavascriptOperators::IsConstructor(constructor)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    local_d9 = pRStack_d8 == constructor;
    JsReentLock::unlock((JsReentLock *)local_88);
    pRVar11 = pRStack_d8;
    bVar3 = local_d9;
    pTVar8 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
    _newLen = pRStack_d8;
    uStack_f0 = endT;
    local_e8 = jsReentLock.m_savedNoJsReentrancy;
    uStack_e7 = jsReentLock._25_7_;
    newObjectCreationFunction.newLenT = endT;
    newObjectCreationFunction.constructor = pRStack_d8;
    newObjectCreationFunction.scriptContext = (ScriptContext *)jsReentLock._24_8_;
    pvVar9 = Js::JavascriptOperators::
             NewObjectCreationHelper_ReentrancySafe<Js::JavascriptArray::SliceHelper<unsigned_long>(Js::JavascriptArray*,Js::TypedArrayBase*,Js::RecyclableObject*,unsigned_long,Js::Arguments&,Js::ScriptContext*)::_lambda()_1_>
                       (pRVar11,(bool)(bVar3 & 1),pTVar8,newObjectCreationFunction);
    pJStack_a8 = (JavascriptArray *)VarTo<Js::RecyclableObject>(pvVar9);
    JsReentLock::MutateArrayObject((JsReentLock *)local_88);
    JsReentLock::relock((JsReentLock *)local_88);
  }
  if (pJStack_a8 == (JavascriptArray *)0x0) {
    if (typedArrayBase_local != (TypedArrayBase *)0x0) {
      GetArrayTypeAndConvert
                ((JavascriptArray *)typedArrayBase_local,(bool *)((long)&startT + 7),
                 (bool *)((long)&startT + 6));
    }
    if (0xffffffff < endT) {
      JavascriptError::ThrowRangeError((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec5b,(PCWSTR)0x0);
    }
    newObj = (RecyclableObject *)
             CreateNewArrayHelper
                       ((uint32)endT,(bool)(startT._7_1_ & 1),(bool)(startT._6_1_ & 1),
                        (JavascriptArray *)typedArrayBase_local,(ScriptContext *)jsReentLock._24_8_)
    ;
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(newObj);
    pJStack_a8 = (JavascriptArray *)newObj;
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_88,newObj);
  }
  else {
    newObj = (RecyclableObject *)TryVarToNonES5Array(pJStack_a8);
    if ((JavascriptArray *)newObj != (JavascriptArray *)0x0) {
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(newObj);
    }
  }
  local_fc = (uint32)newLenT;
  local_100 = (uint32)endT;
  if (pJStack_a8 == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x194f,"(newObj)","newObj");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if (local_100 == 0) {
    pArr_local = pJStack_a8;
  }
  else {
    if ((typedArrayBase_local != (TypedArrayBase *)0x0) && (bVar4 = IsNonES5Array(obj), !bVar4)) {
      bVar4 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x195b,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      typedArrayBase_local = (TypedArrayBase *)0x0;
    }
    if (typedArrayBase_local == (TypedArrayBase *)0x0) {
      if (obj_local == (RecyclableObject *)0x0) {
        JsReentLock::unlock((JsReentLock *)local_88);
        pArr_local = (JavascriptArray *)
                     SliceObjectHelper(obj,local_fc,0,(JavascriptArray *)newObj,
                                       (RecyclableObject *)pJStack_a8,local_100,
                                       (ScriptContext *)jsReentLock._24_8_);
        goto LAB_010f5f9d;
      }
      bVar4 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
      pJVar13 = pJStack_a8;
      if (!bVar4) {
        bVar4 = VarIsCorrectType<Js::TypedArrayBase>((TypedArrayBase *)obj_local);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x19bd,"(VarIsCorrectType(typedArrayBase))",
                                      "VarIsCorrectType(typedArrayBase)");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        Throw::FatalInternalError(-0x7fffbffb);
      }
      bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)pJStack_a8);
      if (bVar4) {
        local_2a8 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>
                              ((RecyclableObject *)pJVar13);
      }
      else {
        local_2a8 = (TypedArrayBase *)0x0;
      }
      if ((local_2a8 == (TypedArrayBase *)0x0) && (newObj == (RecyclableObject *)0x0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x19c4,"(newArr != nullptr)","newArr != nullptr");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      for (jsArr._4_4_ = 0; jsArr._4_4_ < local_100; jsArr._4_4_ = jsArr._4_4_ + 1) {
        if (((startT._5_1_ & 1) != 0) ||
           (BVar5 = RecyclableObject::HasItem(obj_local,jsArr._4_4_ + local_fc), BVar5 != 0)) {
          iVar7 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)(jsArr._4_4_ + local_fc));
          if (local_2a8 == (TypedArrayBase *)0x0) {
            (*(newObj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x29])
                      (newObj,(ulong)jsArr._4_4_,CONCAT44(extraout_var,iVar7),0);
          }
          else {
            JsReentLock::unlock((JsReentLock *)local_88);
            (*(local_2a8->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x70])
                      (local_2a8,(ulong)jsArr._4_4_,CONCAT44(extraout_var,iVar7));
            JsReentLock::MutateArrayObject((JsReentLock *)local_88);
            JsReentLock::relock((JsReentLock *)local_88);
          }
        }
      }
    }
    else {
      bVar4 = HasAnyES5ArrayInPrototypeChain((JavascriptArray *)typedArrayBase_local,false);
      if (bVar4) {
        JsReentLock::unlock((JsReentLock *)local_88);
        pArr_local = (JavascriptArray *)
                     SliceObjectHelper(obj,local_fc,0,(JavascriptArray *)newObj,
                                       (RecyclableObject *)pJStack_a8,local_100,
                                       (ScriptContext *)jsReentLock._24_8_);
        goto LAB_010f5f9d;
      }
      if ((newObj == (RecyclableObject *)0x0) || ((startT._4_1_ & 1) == 0)) {
        for (newTypedArray._4_4_ = 0; newTypedArray._4_4_ < local_100;
            newTypedArray._4_4_ = newTypedArray._4_4_ + 1) {
          JsReentLock::unlock((JsReentLock *)local_88);
          iVar7 = (*(typedArrayBase_local->super_ArrayBufferParent).super_ArrayObject.
                    super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                            (typedArrayBase_local,(ulong)(newTypedArray._4_4_ + local_fc),&gotItem_1
                            );
          JsReentLock::MutateArrayObject((JsReentLock *)local_88);
          JsReentLock::relock((JsReentLock *)local_88);
          if (iVar7 != 0) {
            JsReentLock::unlock((JsReentLock *)local_88);
            BVar5 = SetArrayLikeObjects((RecyclableObject *)pJStack_a8,newTypedArray._4_4_,
                                        _gotItem_1);
            ThrowErrorOnFailure(BVar5,(ScriptContext *)jsReentLock._24_8_,newTypedArray._4_4_);
            JsReentLock::MutateArrayObject((JsReentLock *)local_88);
            JsReentLock::relock((JsReentLock *)local_88);
            bVar4 = IsNonES5Array(obj);
            if (!bVar4) {
              bVar4 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
              if (!bVar4) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                            ,0x19b5,"(VarIs<ES5Array>(obj))",
                                            "The array should have been converted to an ES5Array");
                if (!bVar4) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar10 = 0;
              }
              JsReentLock::unlock((JsReentLock *)local_88);
              pArr_local = (JavascriptArray *)
                           SliceObjectHelper(obj,local_fc,newTypedArray._4_4_ + 1,
                                             (JavascriptArray *)newObj,
                                             (RecyclableObject *)pJStack_a8,local_100,
                                             (ScriptContext *)jsReentLock._24_8_);
              goto LAB_010f5f9d;
            }
          }
        }
      }
      else {
        bVar4 = IsDirectAccessArray(newObj);
        if (bVar4) {
          uVar6 = local_fc + local_100;
          pSVar12 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                              ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)
                               &(typedArrayBase_local->super_ArrayBufferParent).arrayBuffer);
          uVar2 = local_100;
          if ((pSVar12->length < uVar6) ||
             (pSVar12 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->
                                  ((WriteBarrierPtr<Js::SparseArraySegmentBase> *)&newObj[2].type),
             pSVar12->size < uVar2)) {
            if ((startT._7_1_ & 1) == 0) {
              if ((startT._6_1_ & 1) == 0) {
                JsReentLock::unlock((JsReentLock *)local_88);
                CopyArrayElements((JavascriptArray *)newObj,0,
                                  (JavascriptArray *)typedArrayBase_local,local_fc,
                                  local_fc + local_100);
                JsReentLock::MutateArrayObject((JsReentLock *)local_88);
                JsReentLock::relock((JsReentLock *)local_88);
              }
              else {
                JsReentLock::unlock((JsReentLock *)local_88);
                dstArray_00 = VarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>
                                        ((JavascriptArray *)newObj);
                srcArray_00 = VarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>
                                        ((JavascriptArray *)typedArrayBase_local);
                CopyNativeFloatArrayElements
                          (dstArray_00,0,srcArray_00,local_fc,local_fc + local_100);
                JsReentLock::MutateArrayObject((JsReentLock *)local_88);
                JsReentLock::relock((JsReentLock *)local_88);
              }
            }
            else {
              JsReentLock::unlock((JsReentLock *)local_88);
              dstArray = VarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>
                                   ((JavascriptArray *)newObj);
              srcArray = VarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>
                                   ((JavascriptArray *)typedArrayBase_local);
              CopyNativeIntArrayElements(dstArray,0,srcArray,local_fc,local_fc + local_100);
              JsReentLock::MutateArrayObject((JsReentLock *)local_88);
              JsReentLock::relock((JsReentLock *)local_88);
            }
          }
          else if ((startT._7_1_ & 1) == 0) {
            if ((startT._6_1_ & 1) == 0) {
              JsReentLock::unlock((JsReentLock *)local_88);
              SliceHelper<void*>((JavascriptArray *)typedArrayBase_local,(JavascriptArray *)newObj,
                                 local_fc,local_100);
              JsReentLock::MutateArrayObject((JsReentLock *)local_88);
              JsReentLock::relock((JsReentLock *)local_88);
            }
            else {
              JsReentLock::unlock((JsReentLock *)local_88);
              SliceHelper<double>((JavascriptArray *)typedArrayBase_local,(JavascriptArray *)newObj,
                                  local_fc,local_100);
              JsReentLock::MutateArrayObject((JsReentLock *)local_88);
              JsReentLock::relock((JsReentLock *)local_88);
            }
          }
          else {
            JsReentLock::unlock((JsReentLock *)local_88);
            SliceHelper<int>((JavascriptArray *)typedArrayBase_local,(JavascriptArray *)newObj,
                             local_fc,local_100);
            JsReentLock::MutateArrayObject((JsReentLock *)local_88);
            JsReentLock::relock((JsReentLock *)local_88);
          }
        }
        else {
          if ((DAT_01ea9ef9 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x198c,"((Js::Configuration::Global.flags.ForceES5Array))",
                                        "newArr can only be ES5Array when it is forced");
            if (!bVar4) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar10 = 0;
          }
          for (element_1._4_4_ = 0; element_1._4_4_ < local_100;
              element_1._4_4_ = element_1._4_4_ + 1) {
            JsReentLock::unlock((JsReentLock *)local_88);
            element_1._0_4_ =
                 (*(typedArrayBase_local->super_ArrayBufferParent).super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                           (typedArrayBase_local,(ulong)(element_1._4_4_ + local_fc),&gotItem);
            JsReentLock::MutateArrayObject((JsReentLock *)local_88);
            JsReentLock::relock((JsReentLock *)local_88);
            if ((int)element_1 != 0) {
              (*(newObj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x29])(newObj,(ulong)element_1._4_4_,_gotItem,0);
              bVar4 = IsNonES5Array(obj);
              if (!bVar4) {
                bVar4 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
                if (!bVar4) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                              ,0x199c,"(VarIs<ES5Array>(obj))",
                                              "The array should have been converted to an ES5Array")
                  ;
                  if (!bVar4) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 0;
                }
                JsReentLock::unlock((JsReentLock *)local_88);
                pArr_local = (JavascriptArray *)
                             SliceObjectHelper(obj,local_fc,element_1._4_4_ + 1,
                                               (JavascriptArray *)newObj,
                                               (RecyclableObject *)pJStack_a8,local_100,
                                               (ScriptContext *)jsReentLock._24_8_);
                goto LAB_010f5f9d;
              }
            }
          }
        }
      }
    }
    if ((startT._5_1_ & 1) == 0) {
      JsReentLock::unlock((JsReentLock *)local_88);
      pJVar13 = pJStack_a8;
      pvVar9 = JavascriptNumber::ToVar(local_100,(ScriptContext *)jsReentLock._24_8_);
      Js::JavascriptOperators::SetProperty
                (pJVar13,(RecyclableObject *)pJVar13,0xd1,pvVar9,(ScriptContext *)jsReentLock._24_8_
                 ,PropertyOperation_ThrowIfNotExtensible);
      JsReentLock::MutateArrayObject((JsReentLock *)local_88);
      JsReentLock::relock((JsReentLock *)local_88);
    }
    pJVar13 = TryVarToNonES5Array(pJStack_a8);
    if (pJVar13 != (JavascriptArray *)0x0) {
      (*(pJVar13->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
    }
    pArr_local = pJStack_a8;
  }
LAB_010f5f9d:
  element._4_4_ = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_88);
  return pArr_local;
}

Assistant:

Var JavascriptArray::SliceHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        JavascriptArray* newArr = nullptr;
        RecyclableObject* newObj = nullptr;
        bool isIntArray = false;
        bool isFloatArray = false;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;
        bool isBuiltinArrayCtor = true;
        T startT = 0;
        T newLenT = length;
        T endT = length;

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pArr);
#endif
        if (args.Info.Count > 1)
        {
            JS_REENTRANT(jsReentLock, startT = GetFromIndex(args[1], length, scriptContext));

            if (args.Info.Count > 2 && JavascriptOperators::GetTypeId(args[2]) != TypeIds_Undefined)
            {
                JS_REENTRANT(jsReentLock, endT = GetFromIndex(args[2], length, scriptContext));
            }

            newLenT = endT > startT ? endT - startT : 0;
        }

        // Side effects (such as defining a property in a ToPrimitive call) during evaluation of arguments start or end may convert the array to an ES5 array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (TypedArrayBase::IsDetachedTypedArray(obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("Array.prototype.slice"));
        }

        // If we came from Array.prototype.slice and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        // If the entry point is %TypedArray%.prototype.slice or the source object is an Array exotic object we should try to load the constructor property
        // and use it to construct the return object.
        if (isTypedArrayEntryPoint)
        {
            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            JS_REENTRANT(jsReentLock,
                RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext));
            isBuiltinArrayCtor = false;

            AssertAndFailFast(pArr == nullptr);
            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            JS_REENTRANT(jsReentLock,
                newObj = VarTo<RecyclableObject>(
                    JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                    {
                        Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(newLenT, scriptContext) };
                        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), (uint32)newLenT, scriptContext);
                    }));
            );
        }

        else if (pArr != nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(pArr, newLenT, scriptContext, &isIntArray, &isFloatArray, &isBuiltinArrayCtor));
        }

        // skip the typed array and "pure" array case, we still need to handle special arrays like es5array, remote array, and proxy of array.
        else
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(obj, newLenT, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        }

        // If we didn't create a new object above we will create a new array here.
        // This is the pre-ES6 behavior or the case of calling Array.prototype.slice with a constructor argument that is not a constructor function.
        if (newObj == nullptr)
        {
            if (pArr)
            {
                pArr->GetArrayTypeAndConvert(&isIntArray, &isFloatArray);
            }

            if (newLenT > JavascriptArray::MaxArrayLength)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }

            newArr = CreateNewArrayHelper(static_cast<uint32>(newLenT), isIntArray, isFloatArray, pArr, scriptContext);
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
            newObj = newArr;
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
            }
        }

        uint32 start  = (uint32) startT;
        uint32 newLen = (uint32) newLenT;

        // We at least have to have newObj as a valid object
        Assert(newObj);

        // Bail out early if the new object will have zero length.
        if (newLen == 0)
        {
            return newObj;
        }

        // The ArraySpeciesCreate call above could have converted the source array into an ES5Array. If this happens
        // we will process the array elements like an ES5Array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr)
        {
            if (HasAnyES5ArrayInPrototypeChain(pArr))
            {
                JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, 0u, newArr, newObj, newLen, scriptContext));
            }

            // If we constructed a new Array object, we have some nice helpers here
            if (newArr && isBuiltinArrayCtor)
            {
                if (JavascriptArray::IsDirectAccessArray(newArr))
                {
                    if (((start + newLen) <= pArr->head->length) && newLen <= newArr->head->size) //Fast Path
                    {
                        if (isIntArray)
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<int32>(pArr, newArr, start, newLen));
                        }
                        else if (isFloatArray)
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<double>(pArr, newArr, start, newLen));
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<Var>(pArr, newArr, start, newLen));
                        }
                    }
                    else
                    {
                        if (isIntArray)
                        {
                            JS_REENTRANT(jsReentLock, CopyNativeIntArrayElements(VarTo<JavascriptNativeIntArray>(newArr), 0, VarTo<JavascriptNativeIntArray>(pArr), start, start + newLen));
                        }
                        else if (isFloatArray)
                        {
                            JS_REENTRANT(jsReentLock, CopyNativeFloatArrayElements(VarTo<JavascriptNativeFloatArray>(newArr), 0, VarTo<JavascriptNativeFloatArray>(pArr), start, start + newLen));
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, CopyArrayElements(newArr, 0u, pArr, start, start + newLen));
                        }
                    }
                }
                else
                {
                    AssertMsg(CONFIG_FLAG(ForceES5Array), "newArr can only be ES5Array when it is forced");
                    Var element;
                    for (uint32 i = 0; i < newLen; i++)
                    {
                        JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(i + start, &element));
                        if (!gotItem)
                        {
                            continue;
                        }

                        newArr->SetItem(i, element, PropertyOperation_None);

                        // Side-effects in the prototype lookup may have changed the source array into an ES5Array. If this happens
                        // we will process the rest of the array elements like an ES5Array.
                        if (!JavascriptArray::IsNonES5Array(obj))
                        {
                            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, i + 1, newArr, newObj, newLen, scriptContext));
                        }
                    }
                }
            }
            else
            {
                // The constructed object isn't an array, we'll need to use normal object manipulation
                Var element;

                for (uint32 i = 0; i < newLen; i++)
                {
                    JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(i + start, &element));
                    if (!gotItem)
                    {
                        continue;
                    }

                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, i, element), scriptContext, i));

                    // Side-effects in the prototype lookup may have changed the source array into an ES5Array. If this happens
                    // we will process the rest of the array elements like an ES5Array.
                    if (!JavascriptArray::IsNonES5Array(obj))
                    {
                        AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, i + 1, newArr, newObj, newLen, scriptContext));
                    }
                }
            }
        }
        else if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));

            // Source is a TypedArray, we must have created the return object via a call to constructor, but newObj may not be a TypedArray (or an array either)
            TypedArrayBase* newTypedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);

            if (!newTypedArray)
            {
                AssertAndFailFast(newArr != nullptr);
            }

            Var element;

            for (uint32 i = 0; i < newLen; i++)
            {
                // We only need to call HasItem in the case that we are called from Array.prototype.slice
                if (!isTypedArrayEntryPoint && !typedArrayBase->HasItem(i + start))
                {
                    continue;
                }

                element = typedArrayBase->DirectGetItem(i + start);

                // The object we got back from the constructor might not be a TypedArray. In fact, it could be any object.
                if (newTypedArray)
                {
                    JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(i, element));
                }
                else
                {
                    newArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, 0u, newArr, newObj, newLen, scriptContext));;
        }

        if (!isTypedArrayEntryPoint)
        {
            JS_REENTRANT(jsReentLock, JavascriptOperators::SetProperty(newObj, newObj, Js::PropertyIds::length, JavascriptNumber::ToVar(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible));
        }

#ifdef VALIDATE_ARRAY
        JavascriptArray * jsArr = JavascriptArray::TryVarToNonES5Array(newObj);
        if (jsArr)
        {
            jsArr->ValidateArray();
        }
#endif

        return newObj;
    }